

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btStaticPlaneShape.cpp
# Opt level: O0

void __thiscall
btStaticPlaneShape::btStaticPlaneShape
          (btStaticPlaneShape *this,btVector3 *planeNormal,btScalar planeConstant)

{
  undefined8 *in_RDI;
  undefined4 in_XMM0_Da;
  btVector3 bVar1;
  btConcaveShape *in_stack_ffffffffffffffa0;
  undefined8 *puVar2;
  btVector3 *in_stack_ffffffffffffffa8;
  btScalar local_30;
  btScalar local_2c;
  btScalar local_28 [5];
  undefined4 local_14;
  
  local_14 = in_XMM0_Da;
  btConcaveShape::btConcaveShape(in_stack_ffffffffffffffa0);
  *in_RDI = &PTR__btStaticPlaneShape_002e58b8;
  btVector3::btVector3((btVector3 *)(in_RDI + 4));
  btVector3::btVector3((btVector3 *)(in_RDI + 6));
  puVar2 = in_RDI + 8;
  bVar1 = btVector3::normalized(in_stack_ffffffffffffffa8);
  *puVar2 = bVar1.m_floats._0_8_;
  puVar2[1] = bVar1.m_floats._8_8_;
  *(undefined4 *)(in_RDI + 10) = local_14;
  local_28[0] = 1.0;
  local_2c = 1.0;
  local_30 = 1.0;
  btVector3::btVector3((btVector3 *)((long)in_RDI + 0x54),local_28,&local_2c,&local_30);
  *(undefined4 *)(in_RDI + 1) = 0x1c;
  return;
}

Assistant:

btStaticPlaneShape::btStaticPlaneShape(const btVector3& planeNormal,btScalar planeConstant)
: btConcaveShape (), m_planeNormal(planeNormal.normalized()),
m_planeConstant(planeConstant),
m_localScaling(btScalar(1.),btScalar(1.),btScalar(1.))
{
	m_shapeType = STATIC_PLANE_PROXYTYPE;
	//	btAssert( btFuzzyZero(m_planeNormal.length() - btScalar(1.)) );
}